

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall Assimp::X3DExporter::IndentationStringSet(X3DExporter *this,size_t pNewLevel)

{
  ulong uVar1;
  long lVar2;
  size_t i_e;
  size_t i;
  size_t pNewLevel_local;
  X3DExporter *this_local;
  
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < pNewLevel) {
    uVar1 = std::__cxx11::string::capacity();
    if (uVar1 < pNewLevel) {
      std::__cxx11::string::reserve((ulong)&this->mIndentationString);
    }
    i_e = 0;
    lVar2 = std::__cxx11::string::size();
    for (; i_e < pNewLevel - lVar2; i_e = i_e + 1) {
      std::__cxx11::string::push_back((char)this + 'p');
    }
  }
  else {
    uVar1 = std::__cxx11::string::size();
    if (pNewLevel < uVar1) {
      std::__cxx11::string::resize((ulong)&this->mIndentationString);
    }
  }
  return;
}

Assistant:

void X3DExporter::IndentationStringSet(const size_t pNewLevel)
{
	if(pNewLevel > mIndentationString.size())
	{
		if(pNewLevel > mIndentationString.capacity()) mIndentationString.reserve(pNewLevel + 1);

		for(size_t i = 0, i_e = pNewLevel - mIndentationString.size(); i < i_e; i++) mIndentationString.push_back('\t');
	}
	else if(pNewLevel < mIndentationString.size())
	{
		mIndentationString.resize(pNewLevel);
	}
}